

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Bounds3f * __thiscall
phyr::Transform::operator()(Bounds3f *__return_storage_ptr__,Transform *this,Bounds3f *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Point3<double> local_80;
  ulong local_68;
  ulong uStack_60;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  double local_30;
  double dStack_28;
  
  dVar16 = (b->pMin).x;
  dVar18 = (b->pMin).y;
  dVar1 = (b->pMin).z;
  dVar13 = (this->mat).d[0][1] * dVar18;
  dVar2 = (this->mat).d[0][0];
  dVar3 = (this->mat).d[0][2];
  dVar12 = (this->mat).d[2][0];
  dVar11 = (this->mat).d[3][1] * dVar18;
  dVar4 = (b->pMax).x;
  dVar5 = (this->mat).d[1][0];
  dVar17 = dVar18 * (this->mat).d[1][1];
  dVar18 = dVar18 * (this->mat).d[2][1];
  dVar6 = (this->mat).d[2][2];
  dVar7 = (this->mat).d[1][2];
  local_80.x = (this->mat).d[0][3];
  local_80.y = (this->mat).d[1][3];
  dVar19 = (this->mat).d[3][2] * dVar1;
  dVar14 = local_80.x + dVar3 * dVar1 + dVar13 + dVar16 * dVar2;
  dVar15 = local_80.y + dVar7 * dVar1 + dVar17 + dVar16 * dVar5;
  local_80.z = (this->mat).d[2][3];
  dVar20 = dVar6 * dVar1 + dVar12 * dVar16 + dVar18 + local_80.z;
  dVar10 = (this->mat).d[3][0];
  dVar9 = (this->mat).d[3][3];
  dVar8 = dVar9 + dVar19 + dVar11 + dVar4 * dVar10;
  dVar9 = dVar9 + dVar19 + dVar11 + dVar16 * dVar10;
  dVar16 = 1.0 / dVar9;
  local_68 = -(ulong)(dVar8 == 1.0);
  uStack_60 = -(ulong)(dVar9 == 1.0);
  if ((uStack_60 & 1) == 0) {
    dVar20 = dVar20 * dVar16;
  }
  local_80.x = local_80.x + dVar3 * dVar1 + dVar2 * dVar4 + dVar13;
  local_80.y = local_80.y + dVar7 * dVar1 + dVar4 * dVar5 + dVar17;
  local_80.z = local_80.z + dVar6 * dVar1 + dVar4 * dVar12 + dVar18;
  dVar18 = (double)(~uStack_60 & (ulong)(dVar16 * dVar14) | (ulong)dVar14 & uStack_60);
  dVar16 = (double)(~uStack_60 & (ulong)(dVar16 * dVar15) | (ulong)dVar15 & uStack_60);
  (__return_storage_ptr__->pMin).x = dVar18;
  (__return_storage_ptr__->pMin).y = dVar16;
  (__return_storage_ptr__->pMin).z = dVar20;
  (__return_storage_ptr__->pMax).x = dVar18;
  (__return_storage_ptr__->pMax).y = dVar16;
  (__return_storage_ptr__->pMax).z = dVar20;
  if ((local_68 & 1) == 0) {
    dVar8 = 1.0 / dVar8;
    local_80.x = local_80.x * dVar8;
    local_80.y = local_80.y * dVar8;
    local_80.z = local_80.z * dVar8;
  }
  unionBounds<double>(__return_storage_ptr__,&local_80);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar16 = (b->pMax).y;
  dVar18 = (b->pMin).x;
  dVar1 = (b->pMin).z;
  dVar12 = (this->mat).d[0][2] * dVar1 + (this->mat).d[0][0] * dVar18 + (this->mat).d[0][1] * dVar16
           + (this->mat).d[0][3];
  dVar3 = dVar1 * (this->mat).d[3][2] + dVar18 * (this->mat).d[3][0] + dVar16 * (this->mat).d[3][1]
          + (this->mat).d[3][3];
  dVar2 = (this->mat).d[1][3] +
          dVar1 * (this->mat).d[1][2] + dVar18 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar16;
  dVar16 = (this->mat).d[2][3] +
           dVar1 * (this->mat).d[2][2] + dVar18 * (this->mat).d[2][0] + (this->mat).d[2][1] * dVar16
  ;
  local_80.z = 1.0 / dVar3;
  local_80.x = dVar12 * local_80.z;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.x = dVar12;
  }
  local_80.y = local_80.z * dVar2;
  local_80.z = local_80.z * dVar16;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.y = dVar2;
    local_80.z = dVar16;
  }
  unionBounds<double>(__return_storage_ptr__,&local_80);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar16 = (b->pMin).x;
  dVar18 = (b->pMin).y;
  dVar1 = (b->pMax).z;
  dVar12 = (this->mat).d[0][2] * dVar1 + (this->mat).d[0][0] * dVar16 + (this->mat).d[0][1] * dVar18
           + (this->mat).d[0][3];
  dVar3 = dVar1 * (this->mat).d[3][2] + dVar16 * (this->mat).d[3][0] + dVar18 * (this->mat).d[3][1]
          + (this->mat).d[3][3];
  dVar2 = (this->mat).d[1][3] +
          dVar1 * (this->mat).d[1][2] + dVar16 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar18;
  dVar16 = (this->mat).d[2][3] +
           dVar1 * (this->mat).d[2][2] + dVar16 * (this->mat).d[2][0] + (this->mat).d[2][1] * dVar18
  ;
  local_80.z = 1.0 / dVar3;
  local_80.x = dVar12 * local_80.z;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.x = dVar12;
  }
  local_80.y = local_80.z * dVar2;
  local_80.z = local_80.z * dVar16;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.y = dVar2;
    local_80.z = dVar16;
  }
  unionBounds<double>(__return_storage_ptr__,&local_80);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar16 = (b->pMin).x;
  dVar18 = (b->pMax).y;
  dVar1 = (b->pMax).z;
  dVar12 = (this->mat).d[0][2] * dVar1 + (this->mat).d[0][0] * dVar16 + (this->mat).d[0][1] * dVar18
           + (this->mat).d[0][3];
  dVar3 = dVar1 * (this->mat).d[3][2] + dVar16 * (this->mat).d[3][0] + dVar18 * (this->mat).d[3][1]
          + (this->mat).d[3][3];
  dVar2 = (this->mat).d[1][3] +
          dVar1 * (this->mat).d[1][2] + dVar16 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar18;
  dVar16 = (this->mat).d[2][3] +
           dVar1 * (this->mat).d[2][2] + dVar16 * (this->mat).d[2][0] + (this->mat).d[2][1] * dVar18
  ;
  local_80.z = 1.0 / dVar3;
  local_80.x = dVar12 * local_80.z;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.x = dVar12;
  }
  local_80.y = local_80.z * dVar2;
  local_80.z = local_80.z * dVar16;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.y = dVar2;
    local_80.z = dVar16;
  }
  unionBounds<double>(__return_storage_ptr__,&local_80);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar16 = (b->pMin).z;
  dVar18 = (b->pMax).x;
  dVar1 = (b->pMax).y;
  dVar3 = (this->mat).d[0][2] * dVar16 + (this->mat).d[0][0] * dVar18 + (this->mat).d[0][1] * dVar1
          + (this->mat).d[0][3];
  dVar12 = dVar16 * (this->mat).d[3][2] + dVar18 * (this->mat).d[3][0] + dVar1 * (this->mat).d[3][1]
           + (this->mat).d[3][3];
  dVar2 = (this->mat).d[1][3] +
          dVar16 * (this->mat).d[1][2] + dVar18 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar1;
  dVar16 = (this->mat).d[2][3] +
           dVar16 * (this->mat).d[2][2] + dVar18 * (this->mat).d[2][0] + (this->mat).d[2][1] * dVar1
  ;
  local_80.z = 1.0 / dVar12;
  local_80.x = dVar3 * local_80.z;
  if ((dVar12 == 1.0) && (!NAN(dVar12))) {
    local_80.x = dVar3;
  }
  local_80.y = local_80.z * dVar2;
  local_80.z = local_80.z * dVar16;
  if ((dVar12 == 1.0) && (!NAN(dVar12))) {
    local_80.y = dVar2;
    local_80.z = dVar16;
  }
  unionBounds<double>(__return_storage_ptr__,&local_80);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar16 = (b->pMin).y;
  dVar18 = (b->pMax).x;
  dVar1 = (b->pMax).z;
  dVar12 = (this->mat).d[0][2] * dVar1 + (this->mat).d[0][0] * dVar18 + (this->mat).d[0][1] * dVar16
           + (this->mat).d[0][3];
  dVar3 = dVar1 * (this->mat).d[3][2] + dVar18 * (this->mat).d[3][0] + dVar16 * (this->mat).d[3][1]
          + (this->mat).d[3][3];
  dVar2 = (this->mat).d[1][3] +
          dVar1 * (this->mat).d[1][2] + dVar18 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar16;
  dVar16 = (this->mat).d[2][3] +
           dVar1 * (this->mat).d[2][2] + dVar18 * (this->mat).d[2][0] + (this->mat).d[2][1] * dVar16
  ;
  local_80.z = 1.0 / dVar3;
  local_80.x = dVar12 * local_80.z;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.x = dVar12;
  }
  local_80.y = local_80.z * dVar2;
  local_80.z = local_80.z * dVar16;
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    local_80.y = dVar2;
    local_80.z = dVar16;
  }
  unionBounds<double>(__return_storage_ptr__,&local_80);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar16 = (b->pMax).x;
  dVar18 = (b->pMax).y;
  dVar1 = (b->pMax).z;
  dVar12 = (this->mat).d[0][2] * dVar1 + (this->mat).d[0][0] * dVar16 + (this->mat).d[0][1] * dVar18
           + (this->mat).d[0][3];
  dVar2 = (this->mat).d[1][3] +
          dVar1 * (this->mat).d[1][2] + dVar16 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar18;
  dVar3 = (this->mat).d[2][3] +
          dVar1 * (this->mat).d[2][2] + dVar16 * (this->mat).d[2][0] + (this->mat).d[2][1] * dVar18;
  dVar16 = dVar1 * (this->mat).d[3][2] + dVar16 * (this->mat).d[3][0] + dVar18 * (this->mat).d[3][1]
           + (this->mat).d[3][3];
  local_80.z = 1.0 / dVar16;
  local_80.x = dVar12 * local_80.z;
  if ((dVar16 == 1.0) && (!NAN(dVar16))) {
    local_80.x = dVar12;
  }
  local_80.y = local_80.z * dVar2;
  local_80.z = local_80.z * dVar3;
  if ((dVar16 == 1.0) && (!NAN(dVar16))) {
    local_80.y = dVar2;
    local_80.z = dVar3;
  }
  unionBounds<double>(__return_storage_ptr__,&local_80);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  return __return_storage_ptr__;
}

Assistant:

inline Bounds3f operator()(const Bounds3f& b) const {
        const Transform &M = *this;
        Bounds3f ret(M(Point3f(b.pMin.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMax.z)));
        return ret;
    }